

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

void __thiscall sqlite::Connection::Connection(Connection *this,string *filename)

{
  int sqlite_error_code;
  Runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->db_ = (sqlite3 *)0x0;
  sqlite_error_code = sqlite3_open((filename->_M_dataplus)._M_p,this);
  if (sqlite_error_code == 0) {
    sqlite3_extended_result_codes(this->db_,1);
    return;
  }
  sqlite3_close(this->db_);
  this_00 = (Runtime_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_50,"Error connecting to db (",filename);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_90 == plVar2) {
    local_80 = *plVar2;
    uStack_78 = (undefined4)plVar1[3];
    uStack_74 = *(undefined4 *)((long)plVar1 + 0x1c);
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  sqlite3_errmsg(this->db_);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*plVar1;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
    local_b0.field_2._M_allocated_capacity = *psVar3;
    local_b0.field_2._8_4_ = (undefined4)plVar1[3];
    local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar3;
  }
  local_b0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  Runtime_error::Runtime_error(this_00,&local_b0,&local_70,sqlite_error_code,(sqlite3 *)0x0);
  __cxa_throw(this_00,&Runtime_error::typeinfo,Runtime_error::~Runtime_error);
}

Assistant:

Connection::Connection(const std::string & filename)
    {
        int status = sqlite3_open(filename.c_str(), &db_);
        if(status != SQLITE_OK)
        {
            sqlite3_close(db_);
            throw Runtime_error("Error connecting to db (" +
                filename + "): " + sqlite3_errmsg(db_), "", status, nullptr);
        }
        sqlite3_extended_result_codes(db_, true);
    }